

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqbaselib.cpp
# Opt level: O0

SQInteger closure_getinfos(HSQUIRRELVM v)

{
  SQObjectPtr *pSVar1;
  SQArray *pSVar2;
  SQString *pSVar3;
  SQUnsignedInteger SVar4;
  SQObjectPtr *in_RDI;
  SQUnsignedInteger n_1;
  SQObjectPtr typecheck;
  SQNativeClosure *nc;
  SQInteger j;
  SQInteger n;
  SQObjectPtr defparams;
  SQObjectPtr params;
  SQInteger nparams;
  SQFunctionProto *f;
  SQTable *res;
  SQObject o;
  SQInteger in_stack_fffffffffffffd58;
  SQSharedState *in_stack_fffffffffffffd60;
  SQVM *this;
  SQArray *in_stack_fffffffffffffd68;
  SQSharedState *in_stack_fffffffffffffd70;
  SQArray *in_stack_fffffffffffffd78;
  SQObjectValue this_00;
  SQObjectPtr *in_stack_fffffffffffffd88;
  SQTable *in_stack_fffffffffffffd90;
  SQTable *in_stack_fffffffffffffd98;
  undefined1 local_1a0 [32];
  SQObjectPtr local_180;
  SQTable *local_170;
  SQObjectPtr local_168;
  SQObjectPtr local_158;
  SQObjectPtr local_148;
  SQObjectPtr local_138;
  SQObjectPtr local_128;
  SQObjectPtr local_118;
  SQClosure *local_108;
  SQObjectPtr local_100;
  SQObjectPtr local_f0;
  SQObjectPtr local_e0;
  SQObjectPtr local_d0;
  SQObjectPtr local_c0;
  SQObjectPtr local_b0;
  SQObjectPtr local_a0;
  SQObjectPtr local_90;
  SQObjectPtr local_80;
  SQRELEASEHOOK local_70;
  SQBool local_68;
  SQObjectPtr local_50;
  SQObjectPtr local_40;
  long local_30;
  SQFunctionProto *local_28;
  SQTable *local_20;
  undefined8 local_18;
  SQClosure *local_10;
  SQObjectPtr *local_8;
  
  local_8 = in_RDI;
  pSVar1 = stack_get((HSQUIRRELVM)in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  local_18 = *(undefined8 *)&pSVar1->super_SQObject;
  local_10 = (pSVar1->super_SQObject)._unVal.pClosure;
  local_20 = SQTable::Create(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
  if ((int)local_18 == 0x8000100) {
    local_28 = local_10->_function;
    local_30 = (local_28->_nparameters + 1) - (ulong)(local_28->_varparams == 0);
    pSVar2 = SQArray::Create(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    SQObjectPtr::SQObjectPtr(&local_40,pSVar2);
    pSVar2 = SQArray::Create(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
    SQObjectPtr::SQObjectPtr(&local_50,pSVar2);
    for (local_68 = 0; (long)local_68 < local_28->_nparameters; local_68 = local_68 + 1) {
      SQArray::Set(in_stack_fffffffffffffd78,(SQInteger)in_stack_fffffffffffffd70,
                   (SQObjectPtr *)in_stack_fffffffffffffd68);
    }
    for (local_70 = (SQRELEASEHOOK)0x0; (long)local_70 < local_28->_ndefaultparams;
        local_70 = local_70 + 1) {
      SQArray::Set(in_stack_fffffffffffffd78,(SQInteger)in_stack_fffffffffffffd70,
                   (SQObjectPtr *)in_stack_fffffffffffffd68);
    }
    if (local_28->_varparams != 0) {
      pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                                (SQInteger)in_stack_fffffffffffffd60);
      SQObjectPtr::SQObjectPtr(&local_80,pSVar3);
      SQArray::Set(in_stack_fffffffffffffd78,(SQInteger)in_stack_fffffffffffffd70,
                   (SQObjectPtr *)in_stack_fffffffffffffd68);
      SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    }
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_90,pSVar3);
    SQObjectPtr::SQObjectPtr(&local_a0,false);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_b0,pSVar3);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_c0,pSVar3);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_d0,pSVar3);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_e0,pSVar3);
    SQObjectPtr::SQObjectPtr(&local_f0,local_28->_varparams);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_100,pSVar3);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
  }
  else {
    local_108 = local_10;
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_118,pSVar3);
    SQObjectPtr::SQObjectPtr(&local_128,true);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_138,pSVar3);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)in_stack_fffffffffffffd68,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_148,pSVar3);
    SQObjectPtr::SQObjectPtr(&local_158,(SQInteger)local_108->_env);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr(&local_168);
    SVar4 = sqvector<long_long>::size((sqvector<long_long> *)&local_108->_root);
    if (SVar4 != 0) {
      sqvector<long_long>::size((sqvector<long_long> *)&local_108->_root);
      SQArray::Create(in_stack_fffffffffffffd60,in_stack_fffffffffffffd58);
      SQObjectPtr::operator=((SQObjectPtr *)in_stack_fffffffffffffd70,in_stack_fffffffffffffd68);
      local_170 = (SQTable *)0x0;
      while (in_stack_fffffffffffffd90 = local_170,
            in_stack_fffffffffffffd98 =
                 (SQTable *)sqvector<long_long>::size((sqvector<long_long> *)&local_108->_root),
            in_stack_fffffffffffffd90 < in_stack_fffffffffffffd98) {
        this_00 = local_168.super_SQObject._unVal;
        in_stack_fffffffffffffd88 =
             (SQObjectPtr *)
             sqvector<long_long>::operator[]
                       ((sqvector<long_long> *)&local_108->_root,(SQUnsignedInteger)local_170);
        SQObjectPtr::SQObjectPtr
                  (&local_180,*(SQInteger *)&in_stack_fffffffffffffd88->super_SQObject);
        SQArray::Set(this_00.pArray,(SQInteger)in_stack_fffffffffffffd70,
                     (SQObjectPtr *)in_stack_fffffffffffffd68);
        SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
        local_170 = (SQTable *)
                    ((long)&(local_170->super_SQDelegable).super_SQCollectable.super_SQRefCounted.
                            _vptr_SQRefCounted + 1);
      }
    }
    pSVar3 = SQString::Create(in_stack_fffffffffffffd70,(SQChar *)local_20,
                              (SQInteger)in_stack_fffffffffffffd60);
    SQObjectPtr::SQObjectPtr((SQObjectPtr *)(local_1a0 + 0x10),pSVar3);
    SQTable::NewSlot(in_stack_fffffffffffffd98,(SQObjectPtr *)in_stack_fffffffffffffd90,
                     in_stack_fffffffffffffd88);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
    SQObjectPtr::~SQObjectPtr((SQObjectPtr *)in_stack_fffffffffffffd60);
  }
  this = (SQVM *)local_1a0;
  SQObjectPtr::SQObjectPtr((SQObjectPtr *)this,local_20);
  SQVM::Push(this,local_8);
  SQObjectPtr::~SQObjectPtr((SQObjectPtr *)this);
  return 1;
}

Assistant:

static SQInteger closure_getinfos(HSQUIRRELVM v) {
    SQObject o = stack_get(v,1);
    SQTable *res = SQTable::Create(_ss(v),4);
    if(sq_type(o) == OT_CLOSURE) {
        SQFunctionProto *f = _closure(o)->_function;
        SQInteger nparams = f->_nparameters + (f->_varparams?1:0);
        SQObjectPtr params = SQArray::Create(_ss(v),nparams);
    SQObjectPtr defparams = SQArray::Create(_ss(v),f->_ndefaultparams);
        for(SQInteger n = 0; n<f->_nparameters; n++) {
            _array(params)->Set((SQInteger)n,f->_parameters[n]);
        }
    for(SQInteger j = 0; j<f->_ndefaultparams; j++) {
            _array(defparams)->Set((SQInteger)j,_closure(o)->_defaultparams[j]);
        }
        if(f->_varparams) {
            _array(params)->Set(nparams-1,SQString::Create(_ss(v),_SC("..."),-1));
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),false);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),f->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("src"),-1),f->_sourcename);
        res->NewSlot(SQString::Create(_ss(v),_SC("parameters"),-1),params);
        res->NewSlot(SQString::Create(_ss(v),_SC("varargs"),-1),f->_varparams);
    res->NewSlot(SQString::Create(_ss(v),_SC("defparams"),-1),defparams);
    }
    else { //OT_NATIVECLOSURE
        SQNativeClosure *nc = _nativeclosure(o);
        res->NewSlot(SQString::Create(_ss(v),_SC("native"),-1),true);
        res->NewSlot(SQString::Create(_ss(v),_SC("name"),-1),nc->_name);
        res->NewSlot(SQString::Create(_ss(v),_SC("paramscheck"),-1),nc->_nparamscheck);
        SQObjectPtr typecheck;
        if(nc->_typecheck.size() > 0) {
            typecheck =
                SQArray::Create(_ss(v), nc->_typecheck.size());
            for(SQUnsignedInteger n = 0; n<nc->_typecheck.size(); n++) {
                    _array(typecheck)->Set((SQInteger)n,nc->_typecheck[n]);
            }
        }
        res->NewSlot(SQString::Create(_ss(v),_SC("typecheck"),-1),typecheck);
    }
    v->Push(res);
    return 1;
}